

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O0

int lib_header_callback(dl_phdr_info *info,size_t size,void *data)

{
  int iVar1;
  ulong uVar2;
  Elf64_Addr *local_68;
  link_map *current;
  Elf64_Addr end_addr;
  Elf64_Addr start_addr;
  Elf64_Addr base_addr;
  Elf64_Addr EStack_40;
  int i;
  Elf64_Addr load_address;
  char *name;
  Addrs *addrs;
  void *data_local;
  size_t size_local;
  dl_phdr_info *info_local;
  
  load_address = 0;
  EStack_40 = 0;
  base_addr._4_4_ = 0;
  do {
    if ((int)(uint)info->dlpi_phnum <= base_addr._4_4_) {
LAB_0048a04c:
      if (load_address != 0) {
        for (local_68 = *(Elf64_Addr **)((long)data + 8); local_68 != (Elf64_Addr *)0x0;
            local_68 = (Elf64_Addr *)local_68[3]) {
          iVar1 = strcmp((char *)local_68[1],(char *)load_address);
          if ((iVar1 == 0) && (EStack_40 == *local_68)) {
            *(Elf64_Addr **)((long)data + 8) = local_68;
            *(undefined4 *)((long)data + 0x10) = 1;
            return 1;
          }
        }
      }
      return 0;
    }
    if (((info->dlpi_phdr[base_addr._4_4_].p_type == 1) &&
        (uVar2 = info->dlpi_addr + info->dlpi_phdr[base_addr._4_4_].p_vaddr, uVar2 <= *data)) &&
       (*data < uVar2 + info->dlpi_phdr[base_addr._4_4_].p_memsz)) {
      load_address = (Elf64_Addr)info->dlpi_name;
      EStack_40 = info->dlpi_addr;
      goto LAB_0048a04c;
    }
    base_addr._4_4_ = base_addr._4_4_ + 1;
  } while( true );
}

Assistant:

int lib_header_callback(struct dl_phdr_info *info, size_t size, void *data) {
  struct Addrs *addrs = data;
  const char *name = NULL;
  ElfW(Addr) load_address = 0;
  for (int i = 0; i < info->dlpi_phnum; ++i) {
    if (info->dlpi_phdr[i].p_type == PT_LOAD) {
      ElfW(Addr) base_addr = info->dlpi_addr;
      ElfW(Addr) start_addr = base_addr + info->dlpi_phdr[i].p_vaddr;
      ElfW(Addr) end_addr = start_addr + info->dlpi_phdr[i].p_memsz;
      if (addrs->lookup_addr >= start_addr && addrs->lookup_addr < end_addr) {
        name = info->dlpi_name;
        load_address = info->dlpi_addr;
        break;
      }
    }
  }
  if (name) {
    struct link_map *current = addrs->lmap;
    while (current) {
      if (strcmp(current->l_name, name) == 0 &&
          load_address == current->l_addr) {
        addrs->lmap = current;
        addrs->found = 1;
        return 1;
      }
      current = current->l_next;  // GCOVR_EXCL_LINE
    }
  }
  return 0;  // GCOVR_EXCL_LINE
}